

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::ROR_AB_X(CPU *this)

{
  uint16_t uVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  
  this->cycles = 7;
  uVar1 = GetWord(this);
  this->cycles = this->cycles - 2;
  uVar5 = (uint)(byte)((char)uVar1 + this->X);
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar5);
  this->cycles = this->cycles - 1;
  bVar3 = (this->field_6).ps << 7;
  bVar4 = bVar3 | (byte)iVar2 >> 1;
  (this->field_6).ps = bVar3 | (bVar4 == 0) * '\x02' | (this->field_6).ps & 0x7c | (byte)iVar2 & 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)uVar5,(ulong)bVar4);
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::ROR_AB_X()
{
    cycles = 7;
    uint8_t addr = GetWord() + X;
    cycles--;
    uint8_t data = ReadByte(addr);
    uint8_t cr = C ? 0b10000000 : 0;
    C = (data & 0b00000001) > 0;
    data >>= 1;
    data |= cr;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}